

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmarkdowntextedit.cpp
# Opt level: O1

void __thiscall QMarkdownTextEdit::updateLineNumberArea(QMarkdownTextEdit *this,QRect rect,int dy)

{
  LineNumArea *this_00;
  char cVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  QRect local_38;
  long local_28;
  undefined8 local_20;
  
  local_38._8_8_ = rect._8_8_;
  this_00 = this->_lineNumArea;
  local_38._0_8_ = rect._0_8_;
  if (dy == 0) {
    local_38.y1 = rect.y1;
    iVar4 = local_38.y1;
    iVar2 = LineNumArea::lineNumAreaWidth(this_00);
    local_28 = (ulong)(uint)iVar4 << 0x20;
    local_20 = CONCAT44((local_38.y2 + iVar4) - local_38.y1,iVar2 + -1);
    QWidget::update((QRect *)this_00);
  }
  else {
    QWidget::scroll((int)this_00,0);
  }
  updateLineNumAreaGeometry(this);
  lVar3 = QAbstractScrollArea::viewport();
  lVar3 = *(long *)(lVar3 + 0x20);
  local_20 = CONCAT44(*(int *)(lVar3 + 0x20) - *(int *)(lVar3 + 0x18),
                      *(int *)(lVar3 + 0x1c) - *(int *)(lVar3 + 0x14));
  iVar4 = (int)&local_28;
  local_28 = 0;
  cVar1 = QRect::contains(&local_38,SUB81(&local_28,0));
  if (cVar1 != '\0') {
    updateLineNumberAreaWidth(this,iVar4);
  }
  return;
}

Assistant:

void QMarkdownTextEdit::updateLineNumberArea(const QRect rect, int dy)
{
    if (dy)
        _lineNumArea->scroll(0, dy);
    else
        _lineNumArea->update(0, rect.y(), _lineNumArea->sizeHint().width(), rect.height());

    updateLineNumAreaGeometry();

    if (rect.contains(viewport()->rect())) {
        updateLineNumberAreaWidth(0);
    }
}